

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void update_component_monitors
               (ecs_world_t *world,ecs_entity_t entity,ecs_entities_t *added,ecs_entities_t *removed
               )

{
  _Bool _Var1;
  _Bool _Var2;
  void *pvVar3;
  ecs_type_t vector;
  ecs_entity_t *peVar4;
  ecs_entities_t entities;
  ecs_entities_t local_38;
  
  _Var1 = update_component_monitor_w_array(world,&world->component_monitors,added);
  _Var2 = update_component_monitor_w_array(world,&world->component_monitors,removed);
  if ((_Var1) || (_Var2)) {
    pvVar3 = _ecs_map_get(world->child_tables,8,entity);
    if (pvVar3 != (void *)0x0) {
      vector = ecs_get_type(world,entity);
      peVar4 = (ecs_entity_t *)_ecs_vector_first(vector,8,0x10);
      local_38.count = ecs_vector_count(vector);
      local_38.array = peVar4;
      update_component_monitor_w_array(world,&world->parent_monitors,&local_38);
    }
  }
  return;
}

Assistant:

static
void update_component_monitors(
    ecs_world_t * world,
    ecs_entity_t entity,
    ecs_entities_t * added,
    ecs_entities_t * removed)
{
    bool childof_changed = update_component_monitor_w_array(
        world, &world->component_monitors, added);

    childof_changed |= update_component_monitor_w_array(
        world, &world->component_monitors, removed);

    /* If this entity is a parent, check if anything changed that could impact
     * its place in the hierarchy. If so, we need to mark all of the parent's
     * entities as dirty. */
    if (childof_changed && 
        ecs_map_get(world->child_tables, ecs_vector_t*, entity)) 
    {
        ecs_type_t type = ecs_get_type(world, entity);
        ecs_entities_t entities = ecs_type_to_entities(type);
        update_component_monitor_w_array(world, 
            &world->parent_monitors, &entities);
    }
}